

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O3

void __thiscall imrt::Plan::Plan(Plan *this,Plan *p)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  Station *this_00;
  _List_node_base *p_Var3;
  mapped_type *ppSVar4;
  _List_node_base *p_Var5;
  int local_5c;
  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
  *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_38;
  
  this->_vptr_Plan = (_func_int **)&PTR__Plan_00133b48;
  local_58 = &this->angle2station;
  p_Var1 = &(this->angle2station)._M_t._M_impl.super__Rb_tree_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->stations;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->stations;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node._M_size = 0;
  this->last_changed = (Station *)0x0;
  local_38 = &this->last_diff;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)local_38;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)local_38;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  ._M_size = 0;
  this->ev = p->ev;
  std::vector<double,_std::allocator<double>_>::vector(&this->w,&p->w);
  local_40 = &this->w;
  std::vector<double,_std::allocator<double>_>::vector(&this->Zmin,&p->Zmin);
  local_50 = &this->Zmax;
  local_48 = &this->Zmin;
  std::vector<double,_std::allocator<double>_>::vector(local_50,&p->Zmax);
  for (p_Var5 = (p->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var5 != (_List_node_base *)&p->stations; p_Var5 = p_Var5->_M_next) {
    this_00 = (Station *)operator_new(0x170);
    Station::Station(this_00,(Station *)p_Var5[1]._M_next);
    if ((p->last_changed != (Station *)0x0) && (p->last_changed->angle == this_00->angle)) {
      this->last_changed = this_00;
    }
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)this_00;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar2 = &(this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
              _M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
    local_5c = this_00->angle;
    ppSVar4 = std::
              map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
              ::operator[](local_58,&local_5c);
    *ppSVar4 = this_00;
  }
  this->evaluation_fx = p->evaluation_fx;
  return;
}

Assistant:

Plan::Plan(const Plan &p): ev(p.ev), w(p.w), Zmin(p.Zmin), Zmax(p.Zmax), last_changed(NULL) {
    //EvaluationFunction aux_ev(p.ev);
    //ev=aux_ev;
    for (list<Station*>::const_iterator it=p.stations.begin();it!=p.stations.end();it++) {
      Station* aux = new Station(**it);
      if (p.last_changed && p.last_changed->getAngle()==aux->getAngle()) last_changed=aux;
      add_station(*aux);
      angle2station[aux->getAngle()]=aux;
      //real_stations.push_back(*aux);
    }
    evaluation_fx=p.evaluation_fx;
  }